

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O2

vector __thiscall
sisl::basis_function::grad_convolution_sum_h<3,sisl::body_centered_cubic<char>,sisl::bcc_linear_rdo>
          (basis_function *this,vector *p,body_centered_cubic<char> *lattice,double *h)

{
  char cVar1;
  basis_function *this_00;
  int iVar2;
  undefined4 extraout_var;
  Scalar *pSVar3;
  Index extraout_RDX;
  vector vVar4;
  vector *value;
  lattice_site c;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  lattice_site s;
  lattice_site extent;
  int local_134;
  basis_function *local_130;
  void *local_128 [2];
  double local_118;
  DenseStorage<int,__1,__1,_1,_0> *local_110;
  DenseStorage<int,__1,__1,_1,_0> *local_108;
  double *local_100;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_f8;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  local_f0;
  void *local_d8;
  LhsNested local_d0;
  RhsNested pMStack_c8;
  void *local_b0 [2];
  DenseStorage<int,__1,__1,_1,_0> local_a0;
  void *local_90 [2];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_80;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
  local_68;
  
  local_130 = this;
  local_100 = h;
  bcc_linear_rdo::get_integer_support<3>();
  local_f8 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)p;
  (*(lattice->super_base_lattice<char>)._vptr_base_lattice[0xe])(local_128,lattice,p);
  (*(lattice->super_base_lattice<char>)._vptr_base_lattice[10])(local_90,lattice);
  this_00 = local_130;
  local_68.m_lhs._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_130,(int *)&local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  local_110 = (DenseStorage<int,__1,__1,_1,_0> *)
              local_f0.
              super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  while ((DenseStorage<int,__1,__1,_1,_0> *)
         local_f0.
         super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start != local_110) {
    local_108 = (DenseStorage<int,__1,__1,_1,_0> *)
                local_f0.
                super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
              (&local_a0,
               (DenseStorage<int,__1,__1,_1,_0> *)
               local_f0.
               super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                *)&local_68,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_128,
               (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
    Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_d8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                *)&local_68);
    iVar2 = (*(lattice->super_base_lattice<char>)._vptr_base_lattice[0x11])
                      (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_d8);
    free(local_d8);
    if ((char)iVar2 != '\0') {
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)&local_68,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_128,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_d8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_68);
      iVar2 = (*(lattice->super_base_lattice<char>)._vptr_base_lattice[0x14])
                        (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_d8);
      free(local_d8);
      if ((char)iVar2 != '\0') {
        for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
          Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                    (&local_80,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_128,
                     (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
          local_d0 = local_80.m_lhs;
          pMStack_c8 = local_80.m_rhs;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    (&local_68,local_f8,
                     (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                      *)&local_d8);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_b0,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                      *)&local_68);
          local_118 = bcc_linear_rdo::dphi<3>(local_100,(vector *)local_b0,&local_134);
          free(local_b0[0]);
          if ((local_118 != 0.0) || (NAN(local_118))) {
            Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                      ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                        *)&local_68,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_128,
                       (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
            Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                      ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_d8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                        *)&local_68);
            iVar2 = (*(lattice->super_base_lattice<char>)._vptr_base_lattice[5])
                              (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_d8)
            ;
            cVar1 = *(char *)CONCAT44(extraout_var,iVar2);
            pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                local_130,(long)local_134);
            *pSVar3 = local_118 * (double)(int)cVar1 + *pSVar3;
            free(local_d8);
          }
        }
      }
    }
    free(local_a0.m_data);
    local_f0.
    super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(local_108 + 1);
  }
  free(local_90[0]);
  free(local_128[0]);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_f0);
  vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_130;
  return (vector)vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

static vector grad_convolution_sum_h(const vector &p, const L *lattice, const double &h) {
            auto sites = BF::template get_integer_support<N>();
            lattice_site c = lattice->get_nearest_site(p);
            lattice_site extent = lattice->get_dimensions();

            vector value(N);
            value.setZero();

            for(lattice_site s : sites) {
                if(!lattice->is_lattice_site(c+s)) continue;
                if(!lattice->is_filled(c+s)) continue;

                for(int j = 0; j < N; j++) {
                    double w = BF::template dphi<N>(h, p - (c+s).cast<double>(), j);
                    if(w == 0.) continue;
                    value[j] += w * (*lattice)(c + s);
                }
            }
            return value;
        }